

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

bitset_container_t * bitset_container_from_array(array_container_t *ac)

{
  int iVar1;
  bitset_container_t *bitset;
  int local_20;
  int i;
  int limit;
  bitset_container_t *ans;
  array_container_t *ac_local;
  
  bitset = bitset_container_create();
  iVar1 = array_container_cardinality(ac);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    bitset_container_set(bitset,ac->array[local_20]);
  }
  return bitset;
}

Assistant:

bitset_container_t *bitset_container_from_array(const array_container_t *ac) {
    bitset_container_t *ans = bitset_container_create();
    int limit = array_container_cardinality(ac);
    for (int i = 0; i < limit; ++i) bitset_container_set(ans, ac->array[i]);
    return ans;
}